

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::RegOpnd::RegOpnd(RegOpnd *this,RegOpnd *other,StackSym *sym)

{
  bool value;
  StackSym *sym_local;
  RegOpnd *other_local;
  RegOpnd *this_local;
  
  Opnd::Opnd(&this->super_Opnd);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_01ddd8e0;
  Initialize(this,sym,other->m_reg,(other->super_Opnd).m_type);
  (this->super_Opnd).m_valueType.field_0 = (other->super_Opnd).m_valueType.field_0;
  value = Opnd::GetIsJITOptimizedReg(&other->super_Opnd);
  Opnd::SetIsJITOptimizedReg(&this->super_Opnd,value);
  this->field_0x18 = this->field_0x18 & 0xfb | other->field_0x18 & 4;
  this->field_0x18 = this->field_0x18 & 0xef | other->field_0x18 & 0x10;
  this->field_0x18 = this->field_0x18 & 0xbf | ((byte)other->field_0x18 >> 6 & 1) << 6;
  return;
}

Assistant:

RegOpnd::RegOpnd(const RegOpnd &other, StackSym *const sym)
{
    Initialize(sym, other.m_reg, other.m_type);

    m_valueType = other.m_valueType;
    SetIsJITOptimizedReg(other.GetIsJITOptimizedReg());
    m_dontDeadStore = other.m_dontDeadStore;
    m_wasNegativeZeroPreventedByBailout = other.m_wasNegativeZeroPreventedByBailout;

#if DBG
    m_symValueFrozen = other.m_symValueFrozen;
#endif
}